

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_value(basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
             *this,json_visitor *visitor,uint8_t type,error_code *ec)

{
  binary_iterator_source<(anonymous_namespace)::MyIterator> *this_00;
  string_type *buffer;
  char *first;
  pointer puVar1;
  size_t length_00;
  pointer puVar2;
  int iVar3;
  bson_errc __e;
  byte bVar4;
  type_conflict2 tVar5;
  size_t *psVar6;
  _func_int **pp_Var7;
  undefined7 in_register_00000011;
  size_t length_01;
  size_t length_02;
  undefined8 uVar8;
  type_conflict4 *ptVar9;
  uint8_t auVar10 [8];
  type tVar11;
  decimal128_to_chars_result dVar12;
  undefined8 uStack_90;
  uint8_t buf [8];
  uint8_t buf_4 [4];
  uint8_t uStack_74;
  uint8_t uStack_73;
  uint8_t uStack_72;
  uint8_t uStack_71;
  undefined4 uStack_70;
  type_conflict4 length;
  uint8_t uStack_54;
  uint8_t uStack_53;
  uint8_t uStack_52;
  uint8_t uStack_51;
  pointer local_50;
  json_visitor *local_48;
  uint8_t local_40 [8];
  parse_mode local_34;
  
  ptVar9 = (type_conflict4 *)buf;
  iVar3 = (int)CONCAT71(in_register_00000011,type);
  switch(iVar3) {
  case 1:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf,8);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 8) {
      (*visitor->_vptr_basic_json_visitor[0x12])(buf._0_4_,visitor,0,this,ec);
LAB_001da1af:
      bVar4 = this->cursor_mode_ ^ 1;
      goto LAB_001da1b4;
    }
    break;
  case 3:
    begin_document(this,visitor,ec);
    return;
  case 4:
    if (*(int *)((this->options_)._vptr_bson_decode_options[-3] + 8 +
                (long)&(this->options_)._vptr_bson_decode_options) <
        (int)(((long)(this->state_stack_).
                     super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->state_stack_).
                    super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      __e = max_nesting_depth_exceeded;
      goto LAB_001d9c76;
    }
    buf = (uint8_t  [8])
          binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                    (&this->source_,buf_4,4);
    if (buf == (uint8_t  [8])0x4) {
      length._0_1_ = buf_4[0];
      length._1_1_ = buf_4[1];
      length._2_1_ = buf_4[2];
      length._3_1_ = buf_4[3];
      (*visitor->_vptr_basic_json_visitor[6])(visitor,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      if (ec->_M_value != 0) {
        return;
      }
      local_34 = array;
      std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
      emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
                 &this->state_stack_,&local_34,&length,(unsigned_long *)buf);
      return;
    }
LAB_001da1dc:
    __e = unexpected_eof;
    goto LAB_001d9c76;
  case 5:
    this_00 = &this->source_;
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (this_00,buf_4,4);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 != 4) goto LAB_001da1dc;
    auVar10 = (uint8_t  [8])(long)(int)buf_4;
    if ((long)auVar10 < 0) {
      __e = length_is_negative;
      goto LAB_001d9c76;
    }
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (this_00,(value_type *)&length,1);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 1) {
      local_48 = visitor;
      puVar1 = (this->bytes_buffer_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar1) {
        (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar1;
      }
      buf[0] = auVar10[0];
      buf[1] = auVar10[1];
      buf[2] = auVar10[2];
      buf[3] = auVar10[3];
      buf[4] = auVar10[4];
      buf[5] = auVar10[5];
      buf[6] = auVar10[6];
      buf[7] = auVar10[7];
      psVar6 = &source_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>_>
                ::max_buffer_length;
      if ((uint)buf_4 < 0x4000) {
        psVar6 = (size_t *)buf;
      }
      local_40[0] = auVar10[0];
      local_40[1] = auVar10[1];
      local_40[2] = auVar10[2];
      local_40[3] = auVar10[3];
      local_40[4] = auVar10[4];
      local_40[5] = auVar10[5];
      local_40[6] = auVar10[6];
      local_40[7] = auVar10[7];
      while ((auVar10 = buf, length_00 = *psVar6, length_00 != 0 &&
             ((this->source_).current_.p_ != (this->source_).end_.p_))) {
        puVar1 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar2 = (this->bytes_buffer_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->bytes_buffer_,(size_type)(puVar1 + (length_00 - (long)puVar2)));
        tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          (this_00,puVar1 + ((long)(this->bytes_buffer_).
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                            (long)puVar2),length_00);
        buf = (uint8_t  [8])((long)auVar10 - tVar5);
        psVar6 = (size_t *)buf;
        if (0x3fff < (long)auVar10 - tVar5) {
          psVar6 = &source_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>_>
                    ::max_buffer_length;
        }
      }
      psVar6 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar6 = *psVar6 + ((long)local_40 - (long)buf);
      if (buf == (uint8_t  [8])0x0) {
        basic_json_visitor<char>::
        byte_string_value<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (local_48,&this->bytes_buffer_,(ulong)_length & 0xff,&this->super_ser_context,ec,0
                  );
        goto LAB_001da1af;
      }
    }
    break;
  case 6:
    pp_Var7 = visitor->_vptr_basic_json_visitor;
    uVar8 = 0xd;
    goto LAB_001da0ed;
  case 7:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf_4,0xc);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 0xc) {
      local_50 = (pointer)CONCAT44(local_50._4_4_,uStack_70);
      length._0_1_ = buf_4[0];
      length._1_1_ = buf_4[1];
      length._2_1_ = buf_4[2];
      length._3_1_ = buf_4[3];
      uStack_54 = uStack_74;
      uStack_53 = uStack_73;
      uStack_52 = uStack_72;
      uStack_51 = uStack_71;
      to_string<std::__cxx11::string>((oid_t *)&length,&this->text_buffer_);
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var7 = visitor->_vptr_basic_json_visitor;
      uStack_90 = 0x13;
LAB_001da081:
      (*pp_Var7[0xc])(visitor,ptVar9,uStack_90,this,ec);
      goto LAB_001da1af;
    }
    break;
  case 8:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf,1);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 1) {
      (*visitor->_vptr_basic_json_visitor[0xb])(visitor,(ulong)(buf[0] != '\0'),0,this,ec);
      goto LAB_001da1af;
    }
    break;
  case 9:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf,8);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 8) {
      pp_Var7 = visitor->_vptr_basic_json_visitor;
      uVar8 = 6;
LAB_001da134:
      (*pp_Var7[0x10])(visitor,buf,uVar8,this,ec);
      goto LAB_001da1af;
    }
    break;
  case 10:
    pp_Var7 = visitor->_vptr_basic_json_visitor;
    uVar8 = 0;
LAB_001da0ed:
    (*pp_Var7[10])(visitor,uVar8,this,ec);
    goto LAB_001da0f6;
  case 0xb:
    (this->text_buffer_)._M_string_length = 0;
    buffer = &this->text_buffer_;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var7 = visitor->_vptr_basic_json_visitor;
    uStack_90 = 0x14;
    goto LAB_001d9e81;
  case 0xc:
  case 0xf:
switchD_001d9bb3_caseD_c:
    __e = unknown_type;
    goto LAB_001d9c76;
  case 0xd:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar11 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_02);
    if (tVar11.ec == success) {
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var7 = visitor->_vptr_basic_json_visitor;
      uStack_90 = 0x15;
      goto LAB_001d9e81;
    }
    goto LAB_001da1d5;
  case 0x10:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf,4);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 4) {
      buf = (uint8_t  [8])(long)(int)buf._0_4_;
LAB_001da12b:
      pp_Var7 = visitor->_vptr_basic_json_visitor;
      uVar8 = 0;
      goto LAB_001da134;
    }
    break;
  case 0x11:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf,8);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 8) {
      (*visitor->_vptr_basic_json_visitor[0xf])(visitor,buf,0,this,ec);
      goto LAB_001da1af;
    }
    break;
  case 0x12:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf,8);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 8) goto LAB_001da12b;
    break;
  case 0x13:
    tVar5 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (&this->source_,buf,0x10);
    psVar6 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar6 = *psVar6 + tVar5;
    if (tVar5 == 0x10) {
      buf_4[0] = buf[0];
      buf_4[1] = buf[1];
      buf_4[2] = buf[2];
      buf_4[3] = buf[3];
      uStack_74 = buf[4];
      uStack_73 = buf[5];
      uStack_72 = buf[6];
      uStack_71 = buf[7];
      (this->text_buffer_)._M_string_length = 0;
      *(this->text_buffer_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::resize((ulong)&this->text_buffer_);
      first = (this->text_buffer_)._M_dataplus._M_p;
      dVar12 = decimal128_to_chars(first,first + (this->text_buffer_)._M_string_length,
                                   (decimal128_t *)buf_4);
      local_50 = (this->text_buffer_)._M_dataplus._M_p;
      _length = (uint8_t  [8])((long)dVar12.ptr - (long)local_50);
      ptVar9 = &length;
      pp_Var7 = visitor->_vptr_basic_json_visitor;
      uStack_90 = 0xb;
      goto LAB_001da081;
    }
    break;
  default:
    if ((iVar3 != 0x7f) && (iVar3 != 0xff)) goto switchD_001d9bb3_caseD_c;
  case 2:
  case 0xe:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar11 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_01);
    if (tVar11.ec != success) {
LAB_001da1d5:
      __e = invalid_utf8_text_string;
LAB_001d9c76:
      std::error_code::operator=(ec,__e);
      this->more_ = false;
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var7 = visitor->_vptr_basic_json_visitor;
    uStack_90 = 0;
LAB_001d9e81:
    (*pp_Var7[0xc])(visitor,buf,uStack_90,this,ec);
LAB_001da0f6:
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    return;
  }
  std::error_code::operator=(ec,unexpected_eof);
  bVar4 = false;
LAB_001da1b4:
  this->more_ = (bool)bVar4;
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }